

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall
QMessageBox::QMessageBox
          (QMessageBox *this,QString *title,QString *text,Icon icon,int button0,int button1,
          int button2,QWidget *parent,WindowFlags f)

{
  QMessageBoxPrivate *pQVar1;
  
  pQVar1 = (QMessageBoxPrivate *)operator_new(0x3b0);
  QMessageBoxPrivate::QMessageBoxPrivate(pQVar1);
  QDialog::QDialog(&this->super_QDialog,(QDialogPrivate *)pQVar1,parent,
                   (WindowFlags)
                   ((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                          super_QFlagsStorage<Qt::WindowType>.i | 0x8003000));
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_007de5b0;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice =
       &PTR__QMessageBox_007de788;
  pQVar1 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QMessageBoxPrivate::init(pQVar1,(EVP_PKEY_CTX *)title);
  setIcon(this,icon);
  QMessageBoxPrivate::addOldButtons(pQVar1,button0,button1,button2);
  return;
}

Assistant:

QMessageBox::QMessageBox(const QString &title, const QString &text, Icon icon,
                         int button0, int button1, int button2, QWidget *parent,
                         Qt::WindowFlags f)
    : QDialog(*new QMessageBoxPrivate, parent,
              f /*| Qt::MSWindowsFixedSizeDialogHint #### */| Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint)
{
    Q_D(QMessageBox);
    d->init(title, text);
    setIcon(icon);
    d->addOldButtons(button0, button1, button2);
}